

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O1

hugeint_t __thiscall
duckdb::NegateOperator::Operation<duckdb::hugeint_t,duckdb::hugeint_t>
          (NegateOperator *this,hugeint_t input)

{
  bool bVar1;
  OutOfRangeException *this_00;
  hugeint_t hVar2;
  hugeint_t local_60;
  string local_50;
  hugeint_t local_30;
  
  local_60.upper = input.lower;
  local_30.lower = 0;
  local_30.upper = -0x8000000000000000;
  local_60.lower = (uint64_t)this;
  local_50._M_dataplus._M_p = (pointer)this;
  local_50._M_string_length = local_60.upper;
  bVar1 = hugeint_t::operator==(&local_30,(hugeint_t *)&local_50);
  if (!bVar1) {
    hVar2 = hugeint_t::operator-(&local_60);
    return hVar2;
  }
  this_00 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"Overflow in negation of integer!","");
  OutOfRangeException::OutOfRangeException(this_00,&local_50);
  __cxa_throw(this_00,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline TR Operation(TA input) {
		auto cast = (TR)input;
		if (!CanNegate<TR>(cast)) {
			throw OutOfRangeException("Overflow in negation of integer!");
		}
		return -cast;
	}